

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryCase::init
          (PrimitivesGeneratedQueryCase *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  bool bVar2;
  ContextType ctxType;
  uint uVar3;
  ostream *poVar4;
  ShaderProgram *this_00;
  TestError *this_01;
  NotSupportedError *this_02;
  char *pcVar5;
  allocator<char> local_2dd;
  ContextType local_2dc;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  _Alloc_hider local_290;
  ostringstream geometrySource;
  ProgramSources sources;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar2) &&
     (bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
     , !bVar2)) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Tests require GL_EXT_geometry_shader extension or higher context version.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
               ,0x123b);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  switch(this->m_test) {
  case TEST_NO_GEOMETRY:
    geometrySource.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &geometrySource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Querying PRIMITIVES_GENERATED while rendering without a geometry shader.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&geometrySource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_NO_AMPLIFICATION:
    geometrySource.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &geometrySource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Querying PRIMITIVES_GENERATED while rendering with a non-amplifying geometry shader."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&geometrySource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_AMPLIFICATION:
    geometrySource.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &geometrySource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Querying PRIMITIVES_GENERATED while rendering with a (3x) amplifying geometry shader."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&geometrySource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_PARTIAL_PRIMITIVES:
    geometrySource.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &geometrySource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Querying PRIMITIVES_GENERATED while rendering with a geometry shader that emits also partial primitives."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&geometrySource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case TEST_INSTANCED:
    geometrySource.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &geometrySource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Querying PRIMITIVES_GENERATED while rendering with a instanced geometry shader."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&geometrySource,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_011e53ef_default;
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &geometrySource.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
switchD_011e53ef_default:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&geometrySource);
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  if (this->m_test != TEST_NO_GEOMETRY) {
    poVar4 = std::operator<<(&geometrySource.super_basic_ostream<char,_std::char_traits<char>_>,
                             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points");
    pcVar5 = glcts::fixed_sample_locations_values + 1;
    if (this->m_test == TEST_INSTANCED) {
      pcVar5 = ", invocations = 3";
    }
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,
                    ") in;\nlayout(triangle_strip, max_vertices = 7) out;\nin highp vec4 v_one[];\nvoid main (void)\n{\n\t// always taken\n\tif (v_one[0].x != 0.0)\n\t{\n\t\tgl_Position = gl_in[0].gl_Position + vec4(0.0, 0.1, 0.0, 0.0);\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[0].gl_Position + vec4(0.1, 0.0, 0.0, 0.0);\n\t\tEmitVertex();\n\t\tgl_Position = gl_in[0].gl_Position - vec4(0.1, 0.0, 0.0, 0.0);\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n"
                   );
    uVar3 = this->m_test - TEST_AMPLIFICATION;
    if (uVar3 < 3) {
      std::operator<<(&geometrySource.super_basic_ostream<char,_std::char_traits<char>_>,
                      &DAT_01881524 + *(int *)(&DAT_01881524 + (ulong)uVar3 * 4));
    }
    std::operator<<(&geometrySource.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_one;\nout highp vec4 v_one;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_one = a_one;\n}\n"
             ,&local_2dd);
  local_2dc.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2b8,&local_2d8,&local_2dc);
  glu::VertexSource::VertexSource((VertexSource *)local_298,&local_2b8);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_298);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,&local_2dd);
  local_2dc.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2b8,&local_2d8,&local_2dc);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_298,&local_2b8);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_298);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)local_298);
  if (local_290._M_p != (pointer)0x0) {
    std::__cxx11::stringbuf::str();
    local_2dc.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    specializeShader(&local_2b8,&local_2d8,&local_2dc);
    glu::GeometrySource::GeometrySource((GeometrySource *)local_298,&local_2b8);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_298);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,&sources);
  glu::ProgramSources::~ProgramSources(&sources);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&geometrySource);
  this->m_program = this_00;
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,this_00);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&geometrySource,"could not build program",(allocator<char> *)&sources);
    tcu::TestError::TestError(this_01,(string *)&geometrySource);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return (int)this->m_program;
}

Assistant:

void PrimitivesGeneratedQueryCase::init (void)
{
	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	// log what test tries to do

	if (m_test == TEST_NO_GEOMETRY)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering without a geometry shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_NO_AMPLIFICATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a non-amplifying geometry shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_AMPLIFICATION)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a (3x) amplifying geometry shader." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_PARTIAL_PRIMITIVES)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a geometry shader that emits also partial primitives." << tcu::TestLog::EndMessage;
	else if (m_test == TEST_INSTANCED)
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying PRIMITIVES_GENERATED while rendering with a instanced geometry shader." << tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	// resources

	m_program = genProgram();
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build program");
}